

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O3

void AudioBackend_StopSound(AudioBackend_Sound *sound)

{
  ma_context *pmVar1;
  
  if (sound != (AudioBackend_Sound *)0x0) {
    if (mutex.pContext == (ma_context *)0x0) {
      sound->playing = false;
      sound->position = 0.0;
    }
    else {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x12a818);
      pmVar1 = mutex.pContext;
      sound->playing = false;
      sound->position = 0.0;
      if (pmVar1 != (ma_context *)0x0) {
        (*(pmVar1->field_22).posix.pthread_mutex_unlock)(0x12a818);
        return;
      }
    }
  }
  return;
}

Assistant:

void AudioBackend_StopSound(AudioBackend_Sound *sound)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	sound->playing = FALSE;
	sound->position = 0.0;

	ma_mutex_unlock(&mutex);
}